

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O3

void __thiscall aalcalc::getsamplesizes(aalcalc *this)

{
  byte bVar1;
  mapped_type *pmVar2;
  byte bVar3;
  int local_2c;
  
  if ((this->alct_output_ == true) && (1 < this->samplesize_)) {
    bVar3 = 0;
    do {
      local_2c = 1 << (bVar3 & 0x1f);
      pmVar2 = std::
               map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
               ::operator[](&this->vec_sample_aal_,&local_2c);
      std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>::resize
                (pmVar2,(long)this->max_summary_id_ + 1);
      bVar1 = bVar3 & 0x1f;
      bVar3 = bVar3 + 1;
    } while ((4 << bVar1) + -1 <= this->samplesize_);
  }
  pmVar2 = std::
           map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
           ::operator[](&this->vec_sample_aal_,&this->samplesize_);
  std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>::resize
            (pmVar2,(long)this->max_summary_id_ + 1);
  return;
}

Assistant:

void aalcalc::getsamplesizes()
{
	// Sample size subsets are fixed and non-overlapping, increasing in size
	// by a factor of 2^n, where n = subset number,
	// i.e. for 10 samples, sets are (1), (2, 3), (4, 5, 6, 7)
	// for 20 samples, sets are (1), (2, 3), (4, 5, 6, 7),
	//                          (8, 9, 10, 11, 12, 13, 14, 15)
	if (alct_output_ && samplesize_ > 1) {
		int i = 0;
		while (((1 << i) + ((1 << i) - 1)) <= samplesize_) {
			vec_sample_aal_[1 << i].resize(max_summary_id_ + 1);
			i++;
		}
	}
	vec_sample_aal_[samplesize_].resize(max_summary_id_ + 1);
}